

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  char *pcVar5;
  uv_cpu_info_t *cpu_infos_00;
  FILE *__stream;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint count_00;
  ulong uVar12;
  ulong __nmemb;
  uv_cpu_info_t *puVar13;
  unsigned_long user;
  FILE *local_480;
  uint local_474;
  uv_cpu_info_t **local_470;
  uint *local_468;
  unsigned_long irq;
  unsigned_long idle;
  unsigned_long sys;
  unsigned_long nice;
  unsigned_long dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  pFVar4 = (FILE *)uv__open_file("/proc/stat");
  if (pFVar4 == (FILE *)0x0) {
    piVar7 = __errno_location();
    return -*piVar7;
  }
  local_468 = (uint *)count;
  pcVar5 = fgets(buf,0x400,pFVar4);
  if (pcVar5 == (char *)0x0) {
LAB_00571b17:
    iVar2 = -5;
  }
  else {
    count_00 = 0;
    while ((pcVar5 = fgets(buf,0x400,pFVar4), pcVar5 != (char *)0x0 &&
           (iVar2 = bcmp(buf,"cpu",3), iVar2 == 0))) {
      count_00 = count_00 + 1;
    }
    if (count_00 == 0) goto LAB_00571b17;
    __nmemb = (ulong)count_00;
    cpu_infos_00 = (uv_cpu_info_t *)uv__calloc(__nmemb,0x38);
    if (cpu_infos_00 == (uv_cpu_info_t *)0x0) {
      iVar2 = -0xc;
    }
    else {
      __stream = (FILE *)uv__open_file("/proc/cpuinfo");
      local_480 = pFVar4;
      local_470 = cpu_infos;
      if (__stream == (FILE *)0x0) {
        piVar7 = __errno_location();
        if (*piVar7 == 0) {
LAB_00571bdf:
          lVar9 = sysconf(2);
          if (lVar9 == 0) {
            __assert_fail("clock_ticks != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x2f1,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
          }
          if (lVar9 == -1) {
            __assert_fail("clock_ticks != (unsigned long) -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x2f0,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
          }
          rewind(pFVar4);
          pcVar5 = fgets(buf,0x400,pFVar4);
          if (pcVar5 == (char *)0x0) goto LAB_00571e19;
          uVar11 = 0;
          while (((pcVar5 = fgets(buf,0x400,pFVar4), pcVar5 != (char *)0x0 && (uVar11 < __nmemb)) &&
                 (iVar2 = bcmp(buf,"cpu",3), iVar2 == 0))) {
            iVar2 = __isoc99_sscanf(buf,"cpu%u ",&local_474);
            if (iVar2 != 1) {
              __assert_fail("r == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                            ,0x305,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
            }
            uVar12 = 4;
            uVar10 = local_474;
            do {
              uVar12 = (ulong)((int)uVar12 + 1);
              bVar1 = 9 < uVar10;
              uVar10 = uVar10 / 10;
            } while (bVar1);
            iVar2 = __isoc99_sscanf(buf + uVar12,"%lu %lu %lu %lu %lu %lu",&user,&nice,&sys,&idle,
                                    &dummy,&irq);
            if (iVar2 != 6) goto LAB_00571e19;
            cpu_infos_00[uVar11].cpu_times.user = user * lVar9;
            cpu_infos_00[uVar11].cpu_times.nice = nice * lVar9;
            cpu_infos_00[uVar11].cpu_times.sys = sys * lVar9;
            cpu_infos_00[uVar11].cpu_times.idle = idle * lVar9;
            cpu_infos_00[uVar11].cpu_times.irq = irq * lVar9;
            uVar11 = uVar11 + 1;
          }
          if (count_00 != (uint)uVar11) {
            __assert_fail("num == numcpus",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x321,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
          }
          if (cpu_infos_00->speed == 0) {
            piVar7 = &cpu_infos_00->speed;
            for (uVar11 = 0; __nmemb != uVar11; uVar11 = uVar11 + 1) {
              iVar2 = 0;
              snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                       uVar11 & 0xffffffff);
              pFVar4 = (FILE *)uv__open_file(buf);
              if (pFVar4 != (FILE *)0x0) {
                iVar2 = __isoc99_fscanf(pFVar4,"%lu",&user);
                if (iVar2 != 1) {
                  user = 0;
                }
                fclose(pFVar4);
                iVar2 = (int)(user / 1000);
              }
              *piVar7 = iVar2;
              piVar7 = piVar7 + 0xe;
            }
          }
          *local_470 = cpu_infos_00;
          *local_468 = count_00;
          iVar2 = 0;
          pFVar4 = local_480;
          goto LAB_00571b1b;
        }
        iVar2 = -*piVar7;
      }
      else {
        uVar11 = 0;
        uVar12 = 0;
        puVar13 = cpu_infos_00;
        while( true ) {
          uVar11 = uVar11 & 0xffffffff;
          while( true ) {
            pcVar5 = fgets(buf,0x400,__stream);
            if (pcVar5 == (char *)0x0) {
              fclose(__stream);
              if (uVar12 == 0) {
                pcVar5 = "unknown";
              }
              else {
                pcVar5 = cpu_infos_00[(int)uVar12 - 1].model;
              }
              uVar11 = uVar12 & 0xffffffff;
              if ((uVar12 & 0xffffffff) < __nmemb) {
                uVar11 = __nmemb;
              }
              goto LAB_00571bac;
            }
            if ((uVar12 < __nmemb) && (iVar2 = bcmp(buf,"model name\t: ",0xd), iVar2 == 0)) break;
            if ((uVar11 < __nmemb) && (iVar2 = bcmp(buf,read_models_speed_marker,0xb), iVar2 == 0))
            {
              iVar2 = atoi(buf + 0xb);
              cpu_infos_00[uVar11].speed = iVar2;
              uVar11 = uVar11 + 1;
            }
          }
          sVar6 = strlen(buf + 0xd);
          pcVar5 = uv__strndup(buf + 0xd,sVar6 - 1);
          if (pcVar5 == (char *)0x0) break;
          cpu_infos_00[uVar12].model = pcVar5;
          puVar13 = puVar13 + 1;
          uVar12 = uVar12 + 1;
        }
        fclose(__stream);
LAB_00571e00:
        iVar2 = -0xc;
        pFVar4 = local_480;
      }
      uv_free_cpu_info(cpu_infos_00,count_00);
    }
  }
LAB_00571b1b:
  iVar3 = fclose(pFVar4);
  if (iVar3 != 0) {
    piVar7 = __errno_location();
    if ((*piVar7 != 4) && (*piVar7 != 0x73)) {
LAB_00571e19:
      abort();
    }
  }
  return iVar2;
LAB_00571bac:
  pFVar4 = local_480;
  if (uVar12 == uVar11) goto LAB_00571bdf;
  sVar6 = strlen(pcVar5);
  pcVar8 = uv__strndup(pcVar5,sVar6);
  if (pcVar8 == (char *)0x0) goto LAB_00571e00;
  puVar13->model = pcVar8;
  puVar13 = puVar13 + 1;
  uVar11 = uVar11 - 1;
  goto LAB_00571bac;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return -errno;

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = -ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}